

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O3

void __thiscall
preciseUnitOps_normal_Test::~preciseUnitOps_normal_Test(preciseUnitOps_normal_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(preciseUnitOps, normal)
{
    EXPECT_FALSE(isnormal(precise::invalid));
    EXPECT_FALSE(isnormal(precise::defunit));
    EXPECT_TRUE(isnormal(precise::V));
    auto zunit = precise_unit(0.0, m);
    auto nunit = precise::kg / zunit;
    EXPECT_FALSE(isnormal(nunit));
    EXPECT_FALSE(isnormal(
        precise_unit(std::numeric_limits<double>::infinity(), precise::m)));
    EXPECT_FALSE(isnormal(
        precise_unit(-std::numeric_limits<double>::infinity(), precise::m)));
    auto zunit2 = precise_unit(0.0, precise::kg);
    auto nunit2 = zunit2 / zunit;
    EXPECT_FALSE(isnormal(nunit2));
    EXPECT_FALSE(isnormal(precise_unit(-0.25, precise::kg)));
    EXPECT_FALSE(isnormal(precise_unit(1.4e-320, precise::kg * precise::m)));
    EXPECT_TRUE(isnormal(precise_unit(1.4e-306, precise::kg * precise::m)));
    EXPECT_FALSE(isnormal(zunit2));

    EXPECT_TRUE(isnormal(precise::m));
    EXPECT_TRUE(isnormal(precise::m * precise::milli));
}